

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
Recycled<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *this_00;
  unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  *puVar1;
  void **head;
  _Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  if (&(_Var2._M_head_impl)->_map !=
      (DHMap<Kernel::Unit_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
    if ((0 < *(int *)((long)&(_Var2._M_head_impl)->_map + 0x10)) &&
       (Recycled<Lib::DHSet<Kernel::Unit*,Lib::DefaultHash,Lib::DefaultHash2>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
        ::memAlive == '\x01')) {
      DHMap<Kernel::Unit_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                (&(_Var2._M_head_impl)->_map);
      this_00 = mem();
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
           .
           super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
           ._M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl = (DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
      puVar1 = this_00->_cursor;
      if (puVar1 == this_00->_end) {
        Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
        ::expand(this_00);
        puVar1 = this_00->_cursor;
      }
      (puVar1->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl = _Var2._M_head_impl;
      this_00->_cursor = this_00->_cursor + 1;
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
           .
           super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
           ._M_head_impl;
      if (_Var2._M_head_impl == (DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0)
      goto LAB_004d1eb8;
    }
    DHMap<Kernel::Unit_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&(_Var2._M_head_impl)->_map);
    ((_Var2._M_head_impl)->_map)._timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
    ((_Var2._M_head_impl)->_map)._size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = _Var2._M_head_impl;
  }
LAB_004d1eb8:
  (this->_self)._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }